

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconstruction.cpp
# Opt level: O2

void lts2::PerformBIHTOnImage
               (Mat *anImage,Size *patchSize,Point *patchOffset,LBDOperator *LBD,Mat *result,
               int iterations,float sparsity,float patchMean)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  float patchMean_00;
  uint uVar4;
  uint uVar5;
  Rect ROI;
  Size local_400;
  SignOperator A;
  Size local_3e8;
  undefined8 local_3e0;
  undefined8 local_3d8;
  _InputArray local_3d0 [4];
  Mat ocount;
  Mat target;
  Mat resultPatch;
  Mat freak;
  Mat patchOnes;
  Mat inputPatch;
  
  if ((*(uint *)anImage & 0xfff) == 5) {
    local_3d8 = CONCAT44((int)**(undefined8 **)(anImage + 0x40),
                         (int)((ulong)**(undefined8 **)(anImage + 0x40) >> 0x20));
    cv::Mat::create(result,&local_3d8,5);
    cv::Scalar_<double>::Scalar_((Scalar_<double> *)&inputPatch,0.0);
    _ocount = -0x3efdfffa;
    cv::noArray();
    cv::Mat::setTo((_InputArray *)result,(_InputArray *)&ocount);
    local_3e0 = CONCAT44((int)**(undefined8 **)(anImage + 0x40),
                         (int)((ulong)**(undefined8 **)(anImage + 0x40) >> 0x20));
    cv::Scalar_<double>::Scalar_((Scalar_<double> *)&inputPatch,0.0);
    cv::Mat::Mat(&ocount,&local_3e0,5,&inputPatch);
    local_3e8 = *patchSize;
    cv::Mat::ones(&inputPatch,&local_3e8,5);
    cv::MatExpr::operator_cast_to_Mat((MatExpr *)&patchOnes);
    cv::MatExpr::~MatExpr((MatExpr *)&inputPatch);
    SignOperator::SignOperator(&A);
    cv::Mat::Mat(&inputPatch);
    cv::Mat::Mat(&freak);
    cv::Mat::Mat(&resultPatch);
    uVar4 = -(uint)(1 < patchOffset->x);
    uVar5 = -(uint)(1 < patchOffset->y);
    uVar4 = ~uVar4 & 1 | patchOffset->x & uVar4;
    patchOffset->x = uVar4;
    patchOffset->y = ~uVar5 & 1 | patchOffset->y & uVar5;
    for (iVar2 = 0; iVar2 < *(int *)(anImage + 8); iVar2 = iVar2 + patchOffset->y) {
      for (iVar3 = 0; iVar3 < *(int *)(anImage + 0xc); iVar3 = iVar3 + uVar4) {
        ROI.width = patchSize->width;
        ROI.height = patchSize->height;
        ROI.x = iVar3;
        ROI.y = iVar2;
        if ((ROI.height + iVar2 <= *(int *)(anImage + 8)) &&
           (ROI.width + iVar3 <= *(int *)(anImage + 0xc))) {
          cv::Mat::Mat(&target,anImage,(Rect_ *)&ROI);
          local_3d0[0].sz.width = 0;
          local_3d0[0].sz.height = 0;
          local_3d0[0].flags = 0x2010000;
          local_3d0[0].obj = &inputPatch;
          cv::Mat::copyTo((_OutputArray *)&target);
          cv::Mat::~Mat(&target);
          patchMean_00 = patchMean;
          if (patchMean < 0.0) {
            local_3d0[0].sz.width = 0;
            local_3d0[0].sz.height = 0;
            local_3d0[0].flags = 0x1010000;
            local_3d0[0].obj = &inputPatch;
            cv::noArray();
            cv::mean((_InputArray *)&target,local_3d0);
            patchMean_00 = (float)(double)_target;
          }
          (*(LBD->super_LinearOperator)._vptr_LinearOperator[2])(LBD,&inputPatch,&freak);
          SignOperator::Apply(&A,&freak,&freak);
          local_400 = *patchSize;
          std::__cxx11::string::string((string *)&target,"haar",(allocator *)local_3d0);
          BinaryReconstructionWithBIHT
                    (&resultPatch,LBD,&freak,iterations,sparsity,&local_400,patchMean_00,2,
                     (string *)&target);
          std::__cxx11::string::~string((string *)&target);
          cv::Mat::Mat(&target,result,(Rect_ *)&ROI);
          cv::operator+=(&target,&resultPatch);
          cv::Mat::Mat((Mat *)local_3d0,&ocount,(Rect_ *)&ROI);
          cv::Mat::operator=(&target,(Mat *)local_3d0);
          cv::Mat::~Mat((Mat *)local_3d0);
          cv::operator+=(&target,&patchOnes);
          cv::Mat::~Mat(&target);
          uVar4 = patchOffset->x;
        }
      }
    }
    finalize(result,&ocount);
    cv::Mat::~Mat(&resultPatch);
    cv::Mat::~Mat(&freak);
    cv::Mat::~Mat(&inputPatch);
    SignOperator::~SignOperator(&A);
    cv::Mat::~Mat(&patchOnes);
    cv::Mat::~Mat(&ocount);
    return;
  }
  std::__cxx11::string::string
            ((string *)&inputPatch,"anImage.type() == CV_32F && anImage.channels() == 1",
             (allocator *)&ocount);
  uVar1 = cv::error(-0xd7,(string *)&inputPatch,"PerformBIHTOnImage",
                    "/workspace/llm4binary/github/license_c_cmakelists/sansuiso[P]LBDReconstruction/src/LBDReconstruction/reconstruction.cpp"
                    ,0x29f);
  std::__cxx11::string::~string((string *)&inputPatch);
  _Unwind_Resume(uVar1);
}

Assistant:

void lts2::PerformBIHTOnImage(cv::Mat const &anImage, cv::Size patchSize, cv::Point patchOffset,
                             LBDOperator &LBD, cv::Mat &result, int iterations, float sparsity, float patchMean)
{
  CV_Assert(anImage.type() == CV_32F && anImage.channels() == 1);

  // Result image  
  result.create(anImage.size(), CV_32F);
  result.setTo(cv::Scalar(0));

  cv::Mat ocount(anImage.size(), CV_32FC1, cv::Scalar(0));
  cv::Mat patchOnes = cv::Mat::ones(patchSize, CV_32FC1);

  // Binarization operator
  SignOperator A;

  // Loop over the patches
  cv::Mat inputPatch, freak;
  cv::Mat resultPatch;
  patchOffset.x = MAX(1, patchOffset.x);
  patchOffset.y = MAX(1, patchOffset.y);

  for (int y = 0; y < anImage.rows; y += patchOffset.y)
    for (int x = 0; x < anImage.cols; x += patchOffset.x)
    {
      cv::Rect ROI(x, y, patchSize.width, patchSize.height);
      if ( y+patchSize.height > anImage.rows ||
           x+patchSize.width > anImage.cols )
        continue;

      anImage(ROI).copyTo(inputPatch);
      float pmean = patchMean;
      if (pmean < 0.0)
      {
        cv::Scalar mean = cv::mean(inputPatch);
        pmean = (float)mean[0];
      }

      LBD.Apply(inputPatch, freak);
      A.Apply(freak, freak);

      lts2::BinaryReconstructionWithBIHT(resultPatch, LBD, freak,
                                         iterations, sparsity, patchSize, pmean);

      cv::Mat target = result(ROI);
      target += resultPatch;

      target = ocount(ROI);
      target += patchOnes;
    }

  finalize(result, ocount);
}